

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZIntCube3D *this_00;
  TPZVec<long> *this_01;
  int64_t in_stack_00000018;
  TPZManVector<TPZCompElSide,_5> *in_stack_00000020;
  void **in_stack_ffffffffffffffd8;
  TPZMultiphysicsElement *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02502530);
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_025021f8;
  *(undefined ***)in_RDI = &PTR__TPZMultiphysicsCompEl_025021f8;
  this_00 = (TPZIntCube3D *)(in_RDI + 0x78);
  TPZManVector<TPZCompElSide,_5>::TPZManVector(in_stack_00000020,in_stack_00000018);
  this_01 = (TPZVec<long> *)(in_RDI + 0xe8);
  TPZVec<long>::TPZVec(this_01);
  TPZIntCube3D::TPZIntCube3D(this_00,(int)((ulong)this_01 >> 0x20));
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl() : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(), fElementVec(0){
}